

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

FaceHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_face
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VHandles *_indices)

{
  int *rhs;
  pointer pVVar1;
  BaseHandle *pBVar2;
  bool bVar3;
  FaceHandle _fh;
  value_type _heh;
  mostream *pmVar4;
  pointer pVVar5;
  iterator iVar6;
  pointer pVVar7;
  pointer pVVar8;
  undefined1 local_70 [8];
  FaceHalfedgeIter fh_iter;
  VertexHandle vh;
  
  pVVar8 = (_indices->
           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (_indices->
           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)pVVar1 - (long)pVVar8)) {
    do {
      if (pVVar8 == pVVar1) {
        pVVar8 = (_indices->
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        do {
          pVVar5 = pVVar8;
          if (pVVar5 == pVVar1) {
            _fh = TriConnectivity::add_face((TriConnectivity *)this->mesh_,_indices);
            if (_fh.super_BaseHandle.idx_ != -1) {
              if (*(int *)((long)&((PolyConnectivity *)this->mesh_)[1].super_ArrayKernel.
                                  super_BaseKernel.vprops_.properties_.
                                  super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                                  ._M_impl.super__Vector_impl_data + 0x10) == -1) {
                return (BaseHandle)_fh.super_BaseHandle.idx_;
              }
              PolyConnectivity::fh_begin
                        ((FaceHalfedgeIter *)local_70,(PolyConnectivity *)this->mesh_,
                         (FaceHandle)_fh.super_BaseHandle.idx_);
              rhs = &fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
              while( true ) {
                PolyConnectivity::fh_end
                          ((FaceHalfedgeIter *)rhs,(PolyConnectivity *)this->mesh_,
                           (FaceHandle)_fh.super_BaseHandle.idx_);
                bVar3 = Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::operator!=
                                  ((GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)local_70,
                                   (GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)rhs);
                if (!bVar3) break;
                _heh = Iterators::
                       GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                       ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                                    *)local_70);
                fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
                     (int)ArrayKernel::to_vertex_handle
                                    ((ArrayKernel *)this->mesh_,
                                     (HalfedgeHandle)_heh.super_BaseHandle.idx_);
                iVar6 = std::
                        _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
                        ::find(&(this->halfedgeNormals_)._M_t,(key_type *)rhs);
                if ((_Rb_tree_header *)iVar6._M_node !=
                    &(this->halfedgeNormals_)._M_t._M_impl.super__Rb_tree_header) {
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                *)this->mesh_,(HalfedgeHandle)_heh.super_BaseHandle.idx_,
                               (Normal *)&iVar6._M_node[1]._M_parent);
                }
                Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                              *)local_70);
              }
              std::
              _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
              ::clear(&(this->halfedgeNormals_)._M_t);
              return (BaseHandle)_fh.super_BaseHandle.idx_;
            }
LAB_0018ea3a:
            std::
            vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
            ::push_back(&this->failed_faces_,_indices);
            return (FaceHandle)-1;
          }
          pVVar7 = pVVar5 + 1;
          while (pVVar8 = pVVar5 + 1, pVVar7 != pVVar1) {
            pBVar2 = &pVVar7->super_BaseHandle;
            pVVar7 = pVVar7 + 1;
            if ((pVVar5->super_BaseHandle).idx_ == pBVar2->idx_) {
              pmVar4 = omerr();
              std::operator<<(&pmVar4->super_ostream,"ImporterT: Face has equal vertices\n");
              goto LAB_0018ea3a;
            }
          }
        } while( true );
      }
      bVar3 = ArrayKernel::is_valid_handle
                        ((ArrayKernel *)this->mesh_,(VertexHandle)(pVVar8->super_BaseHandle).idx_);
      pVVar8 = pVVar8 + 1;
    } while (bVar3);
    pmVar4 = omerr();
    std::operator<<(&pmVar4->super_ostream,"ImporterT: Face contains invalid vertex index\n");
  }
  return (BaseHandle)-1;
}

Assistant:

virtual FaceHandle add_face(const VHandles& _indices)
  {
    FaceHandle fh;

    if (_indices.size() > 2)
    {
      VHandles::const_iterator it, it2, end(_indices.end());


      // test for valid vertex indices
      for (it=_indices.begin(); it!=end; ++it)
        if (! mesh_.is_valid_handle(*it))
        {
          omerr() << "ImporterT: Face contains invalid vertex index\n";
          return fh;
        }


      // don't allow double vertices
      for (it=_indices.begin(); it!=end; ++it)
        for (it2=it+1; it2!=end; ++it2)
          if (*it == *it2)
          {
            omerr() << "ImporterT: Face has equal vertices\n";
            failed_faces_.push_back(_indices);
            return fh;
          }


      // try to add face
      fh = mesh_.add_face(_indices);
      if (!fh.is_valid())
      {
        failed_faces_.push_back(_indices);
        return fh;
      }

      //write the half edge normals
      if (mesh_.has_halfedge_normals())
      {
        //iterate over all incoming haldedges of the added face
        for (typename Mesh::FaceHalfedgeIter fh_iter = mesh_.fh_begin(fh);
            fh_iter != mesh_.fh_end(fh); ++fh_iter)
        {
          //and write the normals to it
          typename Mesh::HalfedgeHandle heh = *fh_iter;
          typename Mesh::VertexHandle vh = mesh_.to_vertex_handle(heh);
          typename std::map<VertexHandle,Normal>::iterator it_heNs = halfedgeNormals_.find(vh);
          if (it_heNs != halfedgeNormals_.end())
            mesh_.set_normal(heh,it_heNs->second);
        }
        halfedgeNormals_.clear();
      }
    }
    return fh;
  }